

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O2

void __thiscall dtc::fdt::property::parse_string(property *this,text_input_buffer *input)

{
  char cVar1;
  bool bVar2;
  vector<char,_std::allocator<char>_> bytes;
  char c;
  undefined7 uStack_c7;
  undefined1 local_b8 [16];
  string local_a8;
  property_value v;
  
  local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
  local_a8._M_string_length = 0;
  local_a8.field_2._M_local_buf[0] = '\0';
  property_value::property_value(&v,&local_a8);
  std::__cxx11::string::~string((string *)&local_a8);
  cVar1 = text_input_buffer::operator*(input);
  if (cVar1 != '\"') {
    __assert_fail("*input == \'\"\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/davidchisnall[P]dtc/fdt.cc",
                  0x105,"void dtc::fdt::property::parse_string(text_input_buffer &)");
  }
  text_input_buffer::operator++(input);
  bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  bVar2 = false;
  do {
    cVar1 = text_input_buffer::operator*(input);
    _c = (undefined1 *)CONCAT71(uStack_c7,cVar1);
    if (cVar1 == '\"') {
      if (!bVar2) {
        text_input_buffer::consume(input,'\"');
LAB_0012bf02:
        _c = local_b8;
        std::__cxx11::string::
        _M_construct<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>>
                  ((string *)&c,
                   bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_start,
                   bytes.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        std::__cxx11::string::operator=((string *)&v.string_data,(string *)&c);
        std::__cxx11::string::~string((string *)&c);
        std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::push_back
                  (&this->values,&v);
        std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base
                  (&bytes.super__Vector_base<char,_std::allocator<char>_>);
        property_value::~property_value(&v);
        return;
      }
    }
    else if (cVar1 == '\0') goto LAB_0012bf02;
    bVar2 = cVar1 == '\\';
    std::vector<char,_std::allocator<char>_>::push_back(&bytes,&c);
    text_input_buffer::operator++(input);
  } while( true );
}

Assistant:

void
property::parse_string(text_input_buffer &input)
{
	property_value v;
	assert(*input == '"');
	++input;
	std::vector<char> bytes;
	bool isEscaped = false;
	while (char c = *input)
	{
		if (c == '"' && !isEscaped)
		{
			input.consume('"');
			break;
		}
		isEscaped = (c == '\\');
		bytes.push_back(c);
		++input;
	}
	v.string_data = string(bytes.begin(), bytes.end());
	values.push_back(v);
}